

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signature.c
# Opt level: O2

int ndn_signature_info_tlv_encode(ndn_encoder_t *encoder,ndn_signature_t *signature)

{
  uint uVar1;
  ulong uVar2;
  int iVar3;
  uint32_t uVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  uint uVar9;
  uint32_t uVar10;
  uint32_t var;
  uint32_t uVar11;
  bool bVar12;
  
  if (signature->enable_KeyLocator == '\0') {
    uVar4 = 3;
    uVar10 = 0;
  }
  else {
    uVar5 = 0;
    for (lVar8 = 0; iVar3 = 1,
        (ulong)(signature->key_locator_name).components_size * 0x2c - lVar8 != 0;
        lVar8 = lVar8 + 0x2c) {
      uVar1 = *(uint *)((signature->key_locator_name).components[0].value + lVar8 + -4);
      uVar9 = (uint)(signature->key_locator_name).components[0].value[lVar8 + 0x24];
      iVar7 = (0xffff < uVar1) + 3 + (uint)(0xffff < uVar1);
      if (uVar1 < 0xfd) {
        iVar7 = iVar3;
      }
      uVar5 = uVar5 + uVar9 + iVar7 + (uint)(0xfc < uVar9) * 2 + 1;
    }
    iVar7 = (0xffff < uVar5) + 3 + (uint)(0xffff < uVar5);
    if (uVar5 < 0xfd) {
      iVar7 = iVar3;
    }
    uVar10 = uVar5 + iVar7 + 1;
    iVar6 = (0xffff < uVar10) + 3 + (uint)(0xffff < uVar10);
    if (uVar10 < 0xfd) {
      iVar6 = iVar3;
    }
    uVar4 = iVar6 + uVar5 + iVar7 + 5;
  }
  bVar12 = signature->enable_ValidityPeriod == '\0';
  uVar11 = uVar4 + 0x2a;
  if (bVar12) {
    uVar11 = uVar4;
  }
  uVar4 = 0x26;
  if (bVar12) {
    uVar4 = 0;
  }
  var = uVar11 + 6;
  if (signature->enable_SignatureNonce == '\0') {
    var = uVar11;
  }
  if (signature->enable_Timestamp != '\0') {
    uVar2 = signature->timestamp;
    if (uVar2 < 0x100) {
      iVar3 = 3;
    }
    else if (uVar2 < 0x10000) {
      iVar3 = 4;
    }
    else {
      iVar3 = (uint)(uVar2 >> 0x20 != 0) * 4 + 6;
    }
    var = var + iVar3;
  }
  if (signature->enable_Seqnum != '\0') {
    uVar2 = signature->seqnum;
    if (uVar2 < 0x100) {
      iVar3 = 3;
    }
    else if (uVar2 < 0x10000) {
      iVar3 = 4;
    }
    else {
      iVar3 = (uint)(uVar2 >> 0x20 != 0) * 4 + 6;
    }
    var = var + iVar3;
  }
  uVar11 = 0x16;
  if (signature->is_interest != false) {
    uVar11 = 0x2c;
  }
  iVar3 = encoder_append_var(encoder,uVar11);
  if (((iVar3 == 0) && (iVar3 = encoder_append_var(encoder,var), iVar3 == 0)) &&
     (iVar3 = encoder_append_var(encoder,0x1b), iVar3 == 0)) {
    uVar11 = 1;
    iVar3 = encoder_append_var(encoder,1);
    if ((((iVar3 == 0) &&
         (iVar3 = encoder_append_byte_value(encoder,signature->sig_type), iVar3 == 0)) &&
        ((signature->enable_KeyLocator == '\0' ||
         (((iVar3 = encoder_append_var(encoder,0x1c), iVar3 == 0 &&
           (iVar3 = encoder_append_var(encoder,uVar10), iVar3 == 0)) &&
          (iVar3 = ndn_name_tlv_encode(encoder,&signature->key_locator_name), iVar3 == 0)))))) &&
       ((signature->enable_SignatureNonce == '\0' ||
        (((iVar3 = encoder_append_var(encoder,10), iVar3 == 0 &&
          (iVar3 = encoder_append_var(encoder,4), iVar3 == 0)) &&
         (iVar3 = encoder_append_uint32_value(encoder,signature->signature_nonce), iVar3 == 0))))))
    {
      if (signature->enable_Timestamp != '\0') {
        iVar3 = encoder_append_var(encoder,0x28);
        if (iVar3 != 0) {
          return iVar3;
        }
        uVar2 = signature->timestamp;
        if (0xff < uVar2) {
          if (uVar2 < 0x10000) {
            uVar11 = 2;
          }
          else {
            uVar11 = (uint)(uVar2 >> 0x20 != 0) * 4 + 4;
          }
        }
        iVar3 = encoder_append_var(encoder,uVar11);
        if (iVar3 != 0) {
          return iVar3;
        }
        iVar3 = encoder_append_uint_value(encoder,signature->timestamp);
        if (iVar3 != 0) {
          return iVar3;
        }
      }
      if (signature->enable_Seqnum != '\0') {
        iVar3 = encoder_append_var(encoder,0x2a);
        if (iVar3 != 0) {
          return iVar3;
        }
        uVar2 = signature->seqnum;
        if (uVar2 < 0x100) {
          uVar10 = 1;
        }
        else if (uVar2 < 0x10000) {
          uVar10 = 2;
        }
        else {
          uVar10 = (uint)(uVar2 >> 0x20 != 0) * 4 + 4;
        }
        iVar3 = encoder_append_var(encoder,uVar10);
        if (iVar3 != 0) {
          return iVar3;
        }
        iVar3 = encoder_append_uint_value(encoder,signature->seqnum);
        if (iVar3 != 0) {
          return iVar3;
        }
      }
      if ((signature->enable_ValidityPeriod == '\0') ||
         (((iVar3 = encoder_append_var(encoder,0xfd), iVar3 == 0 &&
           (iVar3 = encoder_append_var(encoder,uVar4), iVar3 == 0)) &&
          ((((iVar3 = encoder_append_var(encoder,0xfe), iVar3 == 0 &&
             ((iVar3 = encoder_append_var(encoder,0xf), iVar3 == 0 &&
              (iVar3 = encoder_append_raw_buffer_value
                                 (encoder,(signature->validity_period).not_before,0xf), iVar3 == 0))
             )) && (iVar3 = encoder_append_var(encoder,0xff), iVar3 == 0)) &&
           ((iVar3 = encoder_append_var(encoder,0xf), iVar3 == 0 &&
            (iVar3 = encoder_append_raw_buffer_value
                               (encoder,(signature->validity_period).not_after,0xf), iVar3 == 0)))))
          ))) {
        iVar3 = 0;
      }
    }
  }
  return iVar3;
}

Assistant:

int
ndn_signature_info_tlv_encode(ndn_encoder_t* encoder, const ndn_signature_t* signature)
{
  int ret_val = -1;
  uint32_t info_buffer_size = encoder_probe_block_size(TLV_SignatureType, 1);
  uint32_t key_name_block_size = 0;
  uint32_t validity_period_buffer_size = 0;

  if (signature->enable_KeyLocator > 0) {
    key_name_block_size = ndn_name_probe_block_size(&signature->key_locator_name);
    info_buffer_size += encoder_probe_block_size(TLV_KeyLocator, key_name_block_size);
  }
  if (signature->enable_ValidityPeriod > 0) {
    validity_period_buffer_size = encoder_probe_block_size(TLV_NotBefore, 15);
    validity_period_buffer_size += encoder_probe_block_size(TLV_NotAfter, 15);
    info_buffer_size += encoder_probe_block_size(TLV_ValidityPeriod, validity_period_buffer_size);
  }
  if (signature->enable_SignatureNonce > 0) {
    info_buffer_size += encoder_probe_block_size(TLV_Nonce, 4);
  }
  if (signature->enable_Timestamp > 0) {
    info_buffer_size += encoder_probe_block_size(TLV_Timestamp,
                                                 encoder_probe_uint_length(signature->timestamp));
  }
  if (signature->enable_Seqnum > 0) {
    info_buffer_size += encoder_probe_block_size(TLV_SeqNum,
                                                 encoder_probe_uint_length(signature->seqnum));
  }

  // signatureinfo header
  if (signature->is_interest) {
    ret_val = encoder_append_type(encoder, TLV_InterestSignatureInfo);
  }
  else {
    ret_val = encoder_append_type(encoder, TLV_SignatureInfo);
  }
  if (ret_val != NDN_SUCCESS) return ret_val;
  ret_val = encoder_append_length(encoder, info_buffer_size);
  if (ret_val != NDN_SUCCESS) return ret_val;

  // signature type
  ret_val = encoder_append_type(encoder, TLV_SignatureType);
  if (ret_val != NDN_SUCCESS) return ret_val;
  ret_val = encoder_append_length(encoder, 1);
  if (ret_val != NDN_SUCCESS) return ret_val;
  ret_val = encoder_append_byte_value(encoder, signature->sig_type);
  if (ret_val != NDN_SUCCESS) return ret_val;

  // key locator
  if (signature->enable_KeyLocator) {
    ret_val = encoder_append_type(encoder, TLV_KeyLocator);
    if (ret_val != NDN_SUCCESS) return ret_val;
    ret_val = encoder_append_length(encoder, key_name_block_size);
    if (ret_val != NDN_SUCCESS) return ret_val;
    ret_val = ndn_name_tlv_encode(encoder, &signature->key_locator_name);
    if (ret_val != NDN_SUCCESS) return ret_val;
  }

  // signature nonce
  if (signature->enable_SignatureNonce > 0) {
    ret_val = encoder_append_type(encoder, TLV_Nonce);
    if (ret_val != NDN_SUCCESS) return ret_val;
    ret_val = encoder_append_length(encoder, 4);
    if (ret_val != NDN_SUCCESS) return ret_val;
    ret_val = encoder_append_uint32_value(encoder, signature->signature_nonce);
    if (ret_val != NDN_SUCCESS) return ret_val;
  }

  // timestamp
  if (signature->enable_Timestamp > 0) {
    ret_val = encoder_append_type(encoder, TLV_Timestamp);
    if (ret_val != NDN_SUCCESS) return ret_val;
    ret_val = encoder_append_length(encoder, encoder_probe_uint_length(signature->timestamp));
    if (ret_val != NDN_SUCCESS) return ret_val;
    ret_val = encoder_append_uint_value(encoder, signature->timestamp);
    if (ret_val != NDN_SUCCESS) return ret_val;
  }

  // timestamp
  if (signature->enable_Seqnum > 0) {
    ret_val = encoder_append_type(encoder, TLV_SeqNum);
    if (ret_val != NDN_SUCCESS) return ret_val;
    ret_val = encoder_append_length(encoder, encoder_probe_uint_length(signature->seqnum));
    if (ret_val != NDN_SUCCESS) return ret_val;
    ret_val = encoder_append_uint_value(encoder, signature->seqnum);
    if (ret_val != NDN_SUCCESS) return ret_val;
  }

  // validity period
  if (signature->enable_ValidityPeriod) {
    ret_val = encoder_append_type(encoder, TLV_ValidityPeriod);
    if (ret_val != NDN_SUCCESS) return ret_val;
    ret_val = encoder_append_length(encoder, validity_period_buffer_size);
    if (ret_val != NDN_SUCCESS) return ret_val;

    ret_val = encoder_append_type(encoder, TLV_NotBefore);
    if (ret_val != NDN_SUCCESS) return ret_val;
    ret_val = encoder_append_length(encoder, 15);
    if (ret_val != NDN_SUCCESS) return ret_val;
    ret_val = encoder_append_raw_buffer_value(encoder, signature->validity_period.not_before, 15);
    if (ret_val != NDN_SUCCESS) return ret_val;

    ret_val = encoder_append_type(encoder, TLV_NotAfter);
    if (ret_val != NDN_SUCCESS) return ret_val;
    ret_val = encoder_append_length(encoder, 15);
    if (ret_val != NDN_SUCCESS) return ret_val;
    ret_val = encoder_append_raw_buffer_value(encoder, signature->validity_period.not_after, 15);
    if (ret_val != NDN_SUCCESS) return ret_val;
  }
  return 0;
}